

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int nn_ipc_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  nn_optset *local_40;
  nn_ipc_optset *optset;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  
  local_40 = self;
  if (self == (nn_optset *)0x0) {
    local_40 = (nn_optset *)0x0;
  }
  if (option == 1) {
    *(nn_optset_vfptr **)optval = local_40[1].vfptr;
    *optvallen = 8;
    self_local._4_4_ = 0;
  }
  else if (option == 2) {
    *(undefined4 *)optval = *(undefined4 *)&local_40[2].vfptr;
    *optvallen = 4;
    self_local._4_4_ = 0;
  }
  else if (option == 3) {
    *(undefined4 *)optval = *(undefined4 *)((long)&local_40[2].vfptr + 4);
    *optvallen = 4;
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = -0x5c;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_ipc_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        memcpy(optval, &optset->sec_attr, sizeof(optset->sec_attr));
        *optvallen = sizeof(optset->sec_attr);
        return 0;
    case NN_IPC_OUTBUFSZ:
        *(int *)optval = optset->outbuffersz;
        *optvallen = sizeof (int);
        return 0;
    case NN_IPC_INBUFSZ:
        *(int *)optval = optset->inbuffersz;
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}